

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O0

float half_to_float(uint16_t hv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint32_t lc;
  uint32_t hexpmant;
  anon_union_4_2_947300a4 v;
  uint16_t hv_local;
  
  uVar2 = ((uint)hv << 0x11) >> 4;
  v.i = ((int)(uint)hv >> 0xf) << 0x1f;
  if (uVar2 < 0x800000) {
    if (uVar2 != 0) {
      uVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar3 = (uVar1 ^ 0x1f) - 8;
      v.i = (uVar2 << ((byte)iVar3 & 0x1f) | v.i | 0x38800000) + iVar3 * -0x800000;
    }
  }
  else if (uVar2 < 0xf800000) {
    v.i = (uVar2 | v.i) + 0x38000000;
  }
  else {
    v.i = uVar2 | v.i | 0x7f800000;
  }
  return (float)v.i;
}

Assistant:

static inline float
half_to_float (uint16_t hv)
{
    /* replicate the code here from imath 3.1 since we are on an older
     * version which doesn't have a half that is safe for C code. Same
     * author, so free to do so. */
#    if defined(__GNUC__) || defined(__clang__) || defined(__INTEL_COMPILER)
#        define OUR_LIKELY(x) (__builtin_expect ((x), 1))
#        define OUR_UNLIKELY(x) (__builtin_expect ((x), 0))
#    else
#        define OUR_LIKELY(x) (x)
#        define OUR_UNLIKELY(x) (x)
#    endif
    union
    {
        uint32_t i;
        float    f;
    } v;
    uint32_t hexpmant = ((uint32_t) (hv) << 17) >> 4;
    v.i               = ((uint32_t) (hv >> 15)) << 31;
    if (OUR_LIKELY ((hexpmant >= 0x00800000)))
    {
        v.i |= hexpmant;
        if (OUR_LIKELY ((hexpmant < 0x0f800000)))
            v.i += 0x38000000;
        else
            v.i |= 0x7f800000;
    }
    else if (hexpmant != 0)
    {
        uint32_t lc;
#    if defined(_MSC_VER) && (_M_IX86 || _M_X64)
        lc = __lzcnt (hexpmant);
#    elif defined(__GNUC__) || defined(__clang__)
        lc = (uint32_t) __builtin_clz (hexpmant);
#    else
        lc = 0;
        while (0 == ((hexpmant << lc) & 0x80000000))
            ++lc;
#    endif
        lc -= 8;
        v.i |= 0x38800000;
        v.i |= (hexpmant << lc);
        v.i -= (lc << 23);
    }
    return v.f;
}